

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

sftp_request * fxp_fstat_send(fxp_handle *handle)

{
  sftp_request *psVar1;
  sftp_packet *pkt;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(8);
  BinarySink_put_uint32(pkt->binarysink_,(ulong)psVar1->id);
  BinarySink_put_string(pkt->binarysink_,handle->hstring,(long)handle->hlen);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_fstat_send(struct fxp_handle *handle)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_FSTAT);
    put_uint32(pktout, req->id);
    put_string(pktout, handle->hstring, handle->hlen);
    sftp_send(pktout);

    return req;
}